

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Observed2Galactic
              (double az,double zen,double *glon,double *glat,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  int iVar1;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  int err_code;
  double in_stack_00000088;
  
  iVar1 = Observed2ICRS((double)glon,(double)glat,(double *)julian_date,(double *)longitude,latitude
                        ,elevation_m,pressure_hPa,temperature_celsius,in_stack_00000030,
                        in_stack_00000028,az,in_stack_00000088,relative_humidity,dut1,xp);
  if (iVar1 == 0) {
    ICRS2Galactic(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                  (CEAngleType *)0x131635);
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2Galactic(double az, double zen,
                                 double *glon, double *glat,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um)
{
    // Convert from Observed -> ICRS
    int err_code = Observed2ICRS(az, zen,
                                 glon, glat,
                                 julian_date,
                                 longitude, latitude,
                                 elevation_m, pressure_hPa,
                                 temperature_celsius, relative_humidity,
                                 dut1, xp, yp, wavelength_um) ;
    if (err_code == 0) {
        // Convert from ICRS -> Galactic
        ICRS2Galactic(*glon, *glat, glon, glat,
                      CEAngleType::RADIANS) ;
    }
    
    return err_code ;
}